

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

int __thiscall QDate::daysInMonth(QDate *this,QCalendar cal)

{
  int iVar1;
  long in_FS_OFFSET;
  YearMonthDay YVar2;
  QCalendar local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = 0;
  local_18.d_ptr = cal.d_ptr;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    YVar2 = QCalendar::partsFromDate(&local_18,(QDate)this->jd);
    iVar1 = 0;
    if (YVar2._0_8_ >> 0x20 != 0x80000000) {
      iVar1 = QCalendar::daysInMonth(&local_18,YVar2.month,YVar2.year);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QDate::daysInMonth(QCalendar cal) const
{
    if (isValid()) {
        const auto parts = cal.partsFromDate(*this);
        if (parts.isValid())
            return cal.daysInMonth(parts.month, parts.year);
    }
    return 0;
}